

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

void __thiscall
iutest::detail::ExpressionLHS<unsigned_long>::ExpressionLHS
          (ExpressionLHS<unsigned_long> *this,unsigned_long *lhs)

{
  unsigned_long *lhs_local;
  ExpressionLHS<unsigned_long> *this_local;
  
  this->m_lhs = *lhs;
  std::__cxx11::string::string((string *)&this->m_message);
  AppendMessage<unsigned_long>(this,&this->m_lhs);
  return;
}

Assistant:

explicit ExpressionLHS(T&& lhs) : m_lhs( ::std::forward<T>(lhs) )
    {
        AppendMessage(m_lhs);
    }